

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.c
# Opt level: O1

_Bool cn_cbor_array_replace(cn_cbor *cb_array,cn_cbor *cb_value,int index,cn_cbor_errback *errp)

{
  _Bool _Var1;
  cn_cbor *pcVar2;
  cn_cbor **ppcVar3;
  int iVar4;
  cn_cbor *pcVar5;
  
  if ((cb_value == (cn_cbor *)0x0 || cb_array == (cn_cbor *)0x0) ||
     (cb_array->type != CN_CBOR_ARRAY)) {
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = CN_CBOR_ERR_INVALID_PARAMETER;
    }
    return false;
  }
  if (index == 0) {
    if (cb_array->length < 1) {
      _Var1 = cn_cbor_array_append(cb_array,cb_value,errp);
      return _Var1;
    }
    pcVar2 = cb_array->first_child;
    cb_value->parent = cb_array;
    ppcVar3 = &pcVar2->next;
    cb_value->next = pcVar2->next;
    if (cb_array->last_child == pcVar2) {
      cb_array->last_child = cb_value;
    }
    cb_array->first_child = cb_value;
  }
  else {
    if (cb_array->first_child == (cn_cbor *)0x0) {
      if (errp != (cn_cbor_errback *)0x0) {
        errp->err = CN_CBOR_NO_ERROR;
      }
      pcVar2 = (cn_cbor *)calloc(1,0x38);
      if (pcVar2 == (cn_cbor *)0x0) {
LAB_0019f098:
        if (errp == (cn_cbor_errback *)0x0) {
          return false;
        }
        errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
        return false;
      }
      cb_array->last_child = pcVar2;
      cb_array->first_child = pcVar2;
      pcVar2->parent = cb_array;
      cb_array->length = 1;
      pcVar2->type = CN_CBOR_INVALID;
    }
    pcVar5 = cb_array->first_child;
    if (1 < index) {
      iVar4 = index + -1;
      do {
        if (pcVar5->next == (cn_cbor *)0x0) {
          if (errp != (cn_cbor_errback *)0x0) {
            errp->err = CN_CBOR_NO_ERROR;
          }
          pcVar2 = (cn_cbor *)calloc(1,0x38);
          if (pcVar2 == (cn_cbor *)0x0) goto LAB_0019f098;
          pcVar2->type = CN_CBOR_INVALID;
          pcVar5->next = pcVar2;
          pcVar2->parent = cb_array;
          cb_array->last_child = pcVar2;
          cb_array->length = cb_array->length + 1;
        }
        pcVar5 = pcVar5->next;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    pcVar2 = pcVar5->next;
    if (pcVar2 == (cn_cbor *)0x0) {
      pcVar5->next = cb_value;
      cb_value->parent = cb_array;
      cb_array->last_child = cb_value;
      cb_array->length = cb_array->length + 1;
      return true;
    }
    ppcVar3 = &pcVar2->next;
    cb_value->next = pcVar2->next;
    pcVar5->next = cb_value;
    cb_value->parent = cb_array;
    if (cb_array->last_child == pcVar2) {
      cb_array->last_child = cb_value;
    }
  }
  *ppcVar3 = (cn_cbor *)0x0;
  ppcVar3[1] = (cn_cbor *)0x0;
  cn_cbor_free(pcVar2);
  return true;
}

Assistant:

bool cn_cbor_array_replace(cn_cbor * cb_array, cn_cbor * cb_value, int index, CBOR_CONTEXT_COMMA cn_cbor_errback *errp)
{
	int i;
	cn_cbor * cb_temp;
	cn_cbor * cb_temp2;

	if (!cb_array || !cb_value || cb_array->type != CN_CBOR_ARRAY) {
		if (errp != NULL) errp->err = CN_CBOR_ERR_INVALID_PARAMETER;
		return false;
	}

	if (index == 0) {
		if (cb_array->length > 0) {
			cb_temp = cb_array->first_child;

			cb_value->parent = cb_array;
			cb_value->next = cb_temp->next;
			if (cb_array->last_child == cb_temp) {
				cb_array->last_child = cb_value;
			}
			cb_array->first_child = cb_value;
			cb_temp->parent = NULL;
			cb_temp->next = NULL;
			cn_cbor_free(cb_temp CBOR_CONTEXT_PARAM);
			return true;
		}
		return cn_cbor_array_append(cb_array, cb_value, errp);
	}

	if (cb_array->first_child == NULL) {
		INIT_CB(cb_temp2);
		cb_array->first_child = cb_array->last_child = cb_temp2;
		cb_temp2->parent = cb_array;
		cb_array->length = 1;
		cb_temp2->type = CN_CBOR_INVALID;
	}

	cb_temp = cb_array->first_child;
	for (i = 1; i < index; i++) {
		if (cb_temp->next == NULL) {
			INIT_CB(cb_temp2);
			cb_temp2->type = CN_CBOR_INVALID;
			cb_temp->next = cb_temp2;
			cb_temp2->parent = cb_array;
			cb_array->last_child = cb_temp2;
			cb_array->length += 1;
		}

		cb_temp = cb_temp->next;
	}

	if (cb_temp->next == NULL) {
		cb_temp->next = cb_value;
		cb_value->parent = cb_array;
		cb_array->last_child = cb_value;
		cb_array->length += 1;
		return true;
	}

	cb_temp2 = cb_temp->next;
	cb_value->next = cb_temp2->next;
	cb_temp->next = cb_value;
	cb_value->parent = cb_array;
	if (cb_array->last_child == cb_temp2) {
		cb_array->last_child = cb_value;
	}

	cb_temp2->next = NULL;
	cb_temp2->parent = NULL;
	cn_cbor_free(cb_temp2 CBOR_CONTEXT_PARAM);

	return true;
}